

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t ctrl_set_svc_frame_drop_mode(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  AV1_COMP *pAVar2;
  AOM_SVC_FRAME_DROP_MODE *local_40;
  AV1_COMP *cpi;
  AV1_PRIMARY *ppi;
  __va_list_tag *args_local;
  aom_codec_alg_priv_t_conflict *ctx_local;
  aom_codec_err_t local_4;
  
  pAVar2 = ctx->ppi->cpi;
  uVar1 = args->gp_offset;
  if (uVar1 < 0x29) {
    local_40 = (AOM_SVC_FRAME_DROP_MODE *)((long)(int)uVar1 + (long)args->reg_save_area);
    args->gp_offset = uVar1 + 8;
  }
  else {
    local_40 = (AOM_SVC_FRAME_DROP_MODE *)args->overflow_arg_area;
    args->overflow_arg_area = local_40 + 2;
  }
  (pAVar2->svc).framedrop_mode = *local_40;
  if (((pAVar2->svc).framedrop_mode == AOM_LAYER_DROP) ||
     ((pAVar2->svc).framedrop_mode == AOM_FULL_SUPERFRAME_DROP)) {
    local_4 = AOM_CODEC_OK;
  }
  else {
    local_4 = AOM_CODEC_INVALID_PARAM;
  }
  return local_4;
}

Assistant:

static aom_codec_err_t ctrl_set_svc_frame_drop_mode(aom_codec_alg_priv_t *ctx,
                                                    va_list args) {
  AV1_PRIMARY *const ppi = ctx->ppi;
  AV1_COMP *const cpi = ppi->cpi;
  cpi->svc.framedrop_mode = CAST(AV1E_SET_SVC_FRAME_DROP_MODE, args);
  if (cpi->svc.framedrop_mode != AOM_LAYER_DROP &&
      cpi->svc.framedrop_mode != AOM_FULL_SUPERFRAME_DROP)
    return AOM_CODEC_INVALID_PARAM;
  else
    return AOM_CODEC_OK;
}